

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

int32_t icu_63::ICU_Utility::skipWhitespace(UnicodeString *str,int32_t *pos,UBool advance)

{
  int iVar1;
  int32_t iVar2;
  char16_t *pcVar3;
  UChar *pUVar4;
  UChar *s;
  int32_t p;
  UBool advance_local;
  int32_t *pos_local;
  UnicodeString *str_local;
  
  iVar1 = *pos;
  pcVar3 = UnicodeString::getBuffer(str);
  iVar2 = UnicodeString::length(str);
  pUVar4 = PatternProps::skipWhiteSpace(pcVar3 + iVar1,iVar2 - iVar1);
  iVar2 = (int32_t)((long)pUVar4 - (long)pcVar3 >> 1);
  if (advance != '\0') {
    *pos = iVar2;
  }
  return iVar2;
}

Assistant:

int32_t ICU_Utility::skipWhitespace(const UnicodeString& str, int32_t& pos,
                                    UBool advance) {
    int32_t p = pos;
    const UChar* s = str.getBuffer();
    p = (int32_t)(PatternProps::skipWhiteSpace(s + p, str.length() - p) - s);
    if (advance) {
        pos = p;
    }
    return p;
}